

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall
chrono::ChAssembly::RemoveOtherPhysicsItem(ChAssembly *this,shared_ptr<chrono::ChPhysicsItem> *item)

{
  element_type *peVar1;
  __normal_iterator<std::shared_ptr<chrono::ChPhysicsItem>_*,_std::vector<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>_>
  __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChPhysicsItem>*,std::vector<std::shared_ptr<chrono::ChPhysicsItem>,std::allocator<std::shared_ptr<chrono::ChPhysicsItem>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChPhysicsItem>const>>
                         ((this->otherphysicslist).
                          super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->otherphysicslist).
                          super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,item);
  if (__position._M_current !=
      (this->otherphysicslist).
      super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
    ::_M_erase(&this->otherphysicslist,(iterator)__position._M_current);
    peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_ChObj)._vptr_ChObj[6])(peVar1,0);
    ((this->super_ChPhysicsItem).system)->is_updated = false;
    return;
  }
  __assert_fail("itr != otherphysicslist.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                ,0xf8,
                "void chrono::ChAssembly::RemoveOtherPhysicsItem(std::shared_ptr<ChPhysicsItem>)");
}

Assistant:

void ChAssembly::RemoveOtherPhysicsItem(std::shared_ptr<ChPhysicsItem> item) {
    auto itr = std::find(std::begin(otherphysicslist), std::end(otherphysicslist), item);
    assert(itr != otherphysicslist.end());

    otherphysicslist.erase(itr);
    item->SetSystem(nullptr);

    system->is_updated = false;
}